

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmpack.cpp
# Opt level: O3

wchar_t __thiscall CVmPackPos::getch(CVmPackPos *this)

{
  byte *pbVar1;
  size_t sVar2;
  wchar_t wVar3;
  int iVar4;
  byte *p;
  
  if (this->len != 0) {
    p = (byte *)(this->p).p_;
    do {
      wVar3 = utf8_ptr::s_getch((char *)p);
      if ((0x7f < (uint)wVar3) || (iVar4 = isspace(wVar3), iVar4 == 0)) {
        if (this->len == 0) {
          return L'\0';
        }
        wVar3 = utf8_ptr::s_getch((this->p).p_);
        return wVar3;
      }
      this->idx = this->idx + 1;
      pbVar1 = (byte *)(this->p).p_;
      p = pbVar1 + (ulong)(((*pbVar1 >> 5 & 1) != 0) + 1 & (uint)(*pbVar1 >> 7) * 3) + 1;
      sVar2 = this->len;
      this->len = (size_t)(pbVar1 + (sVar2 - (long)p));
      (this->p).p_ = (char *)p;
    } while (pbVar1 + (sVar2 - (long)p) != (byte *)0x0);
  }
  return L'\0';
}

Assistant:

wchar_t getch()
    {
        /* skip spaces */
        while (len != 0 && is_space(p.getch()))
        {
            ++idx;
            p.inc(&len);
        }

        /* return the current character */
        return getch_raw();
    }